

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

int __thiscall
CVmObject::get_prop_interface
          (CVmObject *this,vm_obj_id_t self,vm_prop_id_t prop,int *min_args,int *opt_args,
          int *varargs)

{
  int iVar1;
  uint uVar2;
  vm_datatype_t vVar3;
  int *in_RCX;
  undefined2 in_DX;
  undefined4 in_ESI;
  long *in_RDI;
  CVmFuncPtr *in_R8;
  vm_val_t *in_R9;
  CVmFuncPtr func;
  vm_obj_id_t source_obj;
  vm_val_t val;
  CVmFuncPtr local_50;
  undefined1 local_44 [4];
  int local_40 [2];
  int *local_38;
  int local_4;
  
  *(undefined4 *)&in_R8->p_ = 0;
  *in_RCX = 0;
  in_R9->typ = 0;
  iVar1 = (**(code **)(*in_RDI + 0x68))(in_RDI,in_DX,local_40,in_ESI,local_44,0);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else if (((local_40[0] == 0xb) || (local_40[0] == 0x11)) || (local_40[0] == 0x12)) {
    CVmFuncPtr::CVmFuncPtr(&local_50);
    iVar1 = CVmFuncPtr::set(in_R8,in_R9);
    if (iVar1 != 0) {
      iVar1 = CVmFuncPtr::get_min_argc((CVmFuncPtr *)0x320d78);
      *in_RCX = iVar1;
      uVar2 = CVmFuncPtr::get_opt_argc(&local_50);
      *(uint *)&in_R8->p_ = uVar2;
      vVar3 = CVmFuncPtr::is_varargs((CVmFuncPtr *)0x320d9e);
      in_R9->typ = vVar3;
    }
    local_4 = 1;
  }
  else if (local_40[0] == 0xe) {
    *in_RCX = *local_38;
    *(int *)&in_R8->p_ = local_38[1];
    in_R9->typ = local_38[2];
    local_4 = 1;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CVmObject::get_prop_interface(VMG_ vm_obj_id_t self, vm_prop_id_t prop,
                                  int &min_args, int &opt_args, int &varargs)
{
    vm_val_t val;
    vm_obj_id_t source_obj;

    /* presume we won't find an argument interface */
    min_args = opt_args = 0;
    varargs = FALSE;

    /* get the property value */
    if (!get_prop(vmg_ prop, &val, self, &source_obj, 0))
    {
        /* we didn't find the property at all */
        return FALSE;
    }
    else if (val.typ == VM_CODEOFS
             || val.typ == VM_OBJX
             || val.typ == VM_BIFPTRX)
    {
        /* 
         *   It's a direct pointer to static code, an object that we execute
         *   on evaluation, or a built-in function pointer.  Try getting a
         *   pointer to the method header.  CODEOFS and BIFPTRX values always
         *   have method headers; OBJX values do if the underlying object is
         *   invokable.  If the object *isn't* invokable, it won't have a
         *   method header; the only way this can happen is that we have a
         *   String object as an OBJX property, which acts like a DSTRING
         *   when evaluated.  That has the default zero-argument interface,
         *   so we can simply leave the return value with the defaults we've
         *   already set up in this case.  
         */
        CVmFuncPtr func;
        if (func.set(vmg_ &val))
        {
            /* it's an invokable - get the interface info from the header */
            min_args = func.get_min_argc();
            opt_args = func.get_opt_argc();
            varargs = func.is_varargs();
        }

        /* got it */
        return TRUE;
    }
    else if (val.typ == VM_NATIVE_CODE)
    {
        /* get the arguments from the native code descriptor */
        min_args = val.val.native_desc->min_argc_;
        opt_args = val.val.native_desc->opt_argc_;
        varargs = val.val.native_desc->varargs_;

        /* we found the property */
        return TRUE;
    }
    else
    {
        /* 
         *   it's not a function, so there are no arguments, but we did find
         *   the property 
         */
        return TRUE;
    }
}